

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.c
# Opt level: O3

int trans_cmp_fn(ScanStateTransition *a,ScanStateTransition *b,hash_fns_t *fns)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  
  if (fns->data[0] == (void *)0x0) {
    uVar1 = (a->live_diff).n;
    if ((uVar1 == (b->live_diff).n) && (uVar2 = (a->accepts_diff).n, uVar2 == (b->accepts_diff).n))
    {
      if ((ulong)uVar1 != 0) {
        uVar3 = 0;
        do {
          if ((a->live_diff).v[uVar3] != (b->live_diff).v[uVar3]) {
            return 1;
          }
          uVar3 = uVar3 + 1;
        } while (uVar1 != uVar3);
      }
      goto LAB_0013f407;
    }
  }
  else {
    uVar2 = (a->accepts_diff).n;
    if (uVar2 == (b->accepts_diff).n) {
LAB_0013f407:
      if (uVar2 != 0) {
        uVar3 = 0;
        do {
          if ((a->accepts_diff).v[uVar3] != (b->accepts_diff).v[uVar3]) {
            return 1;
          }
          uVar3 = uVar3 + 1;
        } while (uVar2 != uVar3);
      }
      return 0;
    }
  }
  return 1;
}

Assistant:

static int trans_cmp_fn(ScanStateTransition *a, ScanStateTransition *b, hash_fns_t *fns) {
  uint i;

  if (!fns->data[0])
    if (a->live_diff.n != b->live_diff.n) return 1;
  if (a->accepts_diff.n != b->accepts_diff.n) return 1;
  if (!fns->data[0])
    for (i = 0; i < a->live_diff.n; i++)
      if (a->live_diff.v[i] != b->live_diff.v[i]) return 1;
  for (i = 0; i < a->accepts_diff.n; i++)
    if (a->accepts_diff.v[i] != b->accepts_diff.v[i]) return 1;
  return 0;
}